

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O1

bool __thiscall
Diligent::DearchiverBase::PSOData<Diligent::RayTracingPipelineStateCreateInfo>::Deserialize
          (PSOData<Diligent::RayTracingPipelineStateCreateInfo> *this,char *Name,
          Serializer<(Diligent::SerializerMode)0> *Ser)

{
  PSO_CREATE_FLAGS *pPVar1;
  bool bVar2;
  
  (this->CreateInfo).super_PipelineStateCreateInfo.PSODesc.super_DeviceObjectAttribs.Name = Name;
  bVar2 = DeserializeInternal(this,Ser);
  if ((!bVar2) ||
     (bVar2 = PSOSerializer<(Diligent::SerializerMode)0>::SerializeAuxData
                        (Ser,&this->AuxData,&this->Allocator), !bVar2)) {
    return false;
  }
  pPVar1 = &(this->CreateInfo).super_PipelineStateCreateInfo.Flags;
  *(undefined1 *)pPVar1 = (char)*pPVar1 | PSO_CREATE_FLAG_DONT_REMAP_SHADER_RESOURCES;
  if ((this->AuxData).NoShaderReflection == true) {
    *(undefined1 *)&(this->InternalCI).Flags =
         (char)(this->InternalCI).Flags | PSO_CREATE_INTERNAL_FLAG_LAST;
  }
  (this->CreateInfo).super_PipelineStateCreateInfo.pInternalData = &this->InternalCI;
  if ((this->CreateInfo).super_PipelineStateCreateInfo.ResourceSignaturesCount != 0) {
    return true;
  }
  (this->CreateInfo).super_PipelineStateCreateInfo.ResourceSignaturesCount = 1;
  *(undefined1 *)&(this->InternalCI).Flags =
       (char)(this->InternalCI).Flags | PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0;
  return true;
}

Assistant:

bool DearchiverBase::PSOData<CreateInfoType>::Deserialize(const char* Name, Serializer<SerializerMode::Read>& Ser)
{
    CreateInfo.PSODesc.Name = Name;

    if (!DeserializeInternal(Ser))
        return false;

    if (!PSOSerializer<SerializerMode::Read>::SerializeAuxData(Ser, AuxData, &Allocator))
        return false;

    CreateInfo.Flags |= PSO_CREATE_FLAG_DONT_REMAP_SHADER_RESOURCES;
    if (AuxData.NoShaderReflection)
        InternalCI.Flags |= PSO_CREATE_INTERNAL_FLAG_NO_SHADER_REFLECTION;

    CreateInfo.pInternalData = &InternalCI;

    if (CreateInfo.ResourceSignaturesCount == 0)
    {
        CreateInfo.ResourceSignaturesCount = 1;
        InternalCI.Flags |= PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0;
    }

    return true;
}